

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_c4c24d::MonochromeTest::ComparePlaneToValue
          (MonochromeTest *this,aom_image_t *img,int plane,int value)

{
  int iVar1;
  int iVar2;
  uint in_ECX;
  int in_EDX;
  aom_image_t *in_RSI;
  int c;
  int r;
  int stride;
  uint8_t *buf;
  int h;
  int w;
  int local_3c;
  int local_38;
  
  iVar1 = aom_img_plane_width(in_RSI,in_EDX);
  iVar2 = aom_img_plane_height(in_RSI,in_EDX);
  local_38 = 0;
  do {
    if (iVar2 <= local_38) {
      return true;
    }
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      if (in_RSI->planes[in_EDX][local_38 * in_RSI->stride[in_EDX] + local_3c] != in_ECX) {
        return false;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool ComparePlaneToValue(const aom_image_t &img, const int plane,
                           const int value) {
    const int w = aom_img_plane_width(&img, plane);
    const int h = aom_img_plane_height(&img, plane);
    const uint8_t *const buf = img.planes[plane];
    const int stride = img.stride[plane];

    for (int r = 0; r < h; ++r) {
      for (int c = 0; c < w; ++c) {
        if (buf[r * stride + c] != value) return false;
      }
    }
    return true;
  }